

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_search.c
# Opt level: O3

ares_status_t ares_lookup_hostaliases(ares_channel_t *channel,char *name,char **alias)

{
  ares_buf_t *buf;
  ares_status_t aVar1;
  ares_status_t aVar2;
  ares_bool_t aVar3;
  char *pcVar4;
  ares_buf_t *buf_00;
  undefined8 *puVar5;
  size_t sVar6;
  size_t idx;
  ares_array_t *lines;
  char hostname [64];
  char fqdn [256];
  ares_array_t *local_188;
  size_t local_180;
  char local_178 [328];
  
  local_188 = (ares_array_t *)0x0;
  if (alias == (char **)0x0 || (name == (char *)0x0 || channel == (ares_channel_t *)0x0)) {
    return ARES_EFORMERR;
  }
  *alias = (char *)0x0;
  if ((channel->flags & 0x40) != 0) {
    return ARES_ENOTFOUND;
  }
  pcVar4 = strchr(name,0x2e);
  if (pcVar4 != (char *)0x0) {
    return ARES_ENOTFOUND;
  }
  pcVar4 = getenv("HOSTALIASES");
  aVar1 = ARES_ENOTFOUND;
  if (pcVar4 != (char *)0x0) {
    buf_00 = ares_buf_create();
    if (buf_00 != (ares_buf_t *)0x0) {
      aVar1 = ares_buf_load_file(pcVar4,buf_00);
      if (((aVar1 == ARES_SUCCESS) &&
          (aVar1 = ares_buf_split(buf_00,(uchar *)"\n",1,ARES_BUF_SPLIT_TRIM,0,&local_188),
          aVar1 == ARES_SUCCESS)) &&
         (local_180 = ares_array_len(local_188), aVar1 = ARES_ENOTFOUND, local_180 != 0)) {
        idx = 0;
        do {
          puVar5 = (undefined8 *)ares_array_at(local_188,idx);
          buf = (ares_buf_t *)*puVar5;
          local_178[0x30] = '\0';
          local_178[0x31] = '\0';
          local_178[0x32] = '\0';
          local_178[0x33] = '\0';
          local_178[0x34] = '\0';
          local_178[0x35] = '\0';
          local_178[0x36] = '\0';
          local_178[0x37] = '\0';
          local_178[0x38] = '\0';
          local_178[0x39] = '\0';
          local_178[0x3a] = '\0';
          local_178[0x3b] = '\0';
          local_178[0x3c] = '\0';
          local_178[0x3d] = '\0';
          local_178[0x3e] = '\0';
          local_178[0x3f] = '\0';
          local_178[0x20] = '\0';
          local_178[0x21] = '\0';
          local_178[0x22] = '\0';
          local_178[0x23] = '\0';
          local_178[0x24] = '\0';
          local_178[0x25] = '\0';
          local_178[0x26] = '\0';
          local_178[0x27] = '\0';
          local_178[0x28] = '\0';
          local_178[0x29] = '\0';
          local_178[0x2a] = '\0';
          local_178[0x2b] = '\0';
          local_178[0x2c] = '\0';
          local_178[0x2d] = '\0';
          local_178[0x2e] = '\0';
          local_178[0x2f] = '\0';
          local_178[0x10] = '\0';
          local_178[0x11] = '\0';
          local_178[0x12] = '\0';
          local_178[0x13] = '\0';
          local_178[0x14] = '\0';
          local_178[0x15] = '\0';
          local_178[0x16] = '\0';
          local_178[0x17] = '\0';
          local_178[0x18] = '\0';
          local_178[0x19] = '\0';
          local_178[0x1a] = '\0';
          local_178[0x1b] = '\0';
          local_178[0x1c] = '\0';
          local_178[0x1d] = '\0';
          local_178[0x1e] = '\0';
          local_178[0x1f] = '\0';
          local_178[0] = '\0';
          local_178[1] = '\0';
          local_178[2] = '\0';
          local_178[3] = '\0';
          local_178[4] = '\0';
          local_178[5] = '\0';
          local_178[6] = '\0';
          local_178[7] = '\0';
          local_178[8] = '\0';
          local_178[9] = '\0';
          local_178[10] = '\0';
          local_178[0xb] = '\0';
          local_178[0xc] = '\0';
          local_178[0xd] = '\0';
          local_178[0xe] = '\0';
          local_178[0xf] = '\0';
          memset(local_178 + 0x40,0,0x100);
          ares_buf_tag(buf);
          ares_buf_consume_nonwhitespace(buf);
          aVar2 = ares_buf_tag_fetch_string(buf,local_178,0x40);
          if ((aVar2 == ARES_SUCCESS) &&
             (aVar3 = ares_strcaseeq(local_178,name), aVar3 != ARES_FALSE)) {
            ares_buf_consume_whitespace(buf,ARES_TRUE);
            ares_buf_tag(buf);
            ares_buf_consume_nonwhitespace(buf);
            aVar2 = ares_buf_tag_fetch_string(buf,local_178 + 0x40,0x100);
            if ((aVar2 == ARES_SUCCESS) &&
               ((sVar6 = ares_strlen(local_178 + 0x40), sVar6 != 0 &&
                (aVar3 = ares_is_hostname(local_178 + 0x40), aVar3 != ARES_FALSE)))) {
              pcVar4 = ares_strdup(local_178 + 0x40);
              *alias = pcVar4;
              aVar1 = ARES_ENOMEM;
              if (pcVar4 != (char *)0x0) {
                aVar1 = ARES_SUCCESS;
              }
              break;
            }
          }
          idx = idx + 1;
        } while (local_180 != idx);
      }
      goto LAB_001154d6;
    }
    aVar1 = ARES_ENOMEM;
  }
  buf_00 = (ares_buf_t *)0x0;
LAB_001154d6:
  ares_buf_destroy(buf_00);
  ares_array_destroy(local_188);
  return aVar1;
}

Assistant:

ares_status_t ares_lookup_hostaliases(const ares_channel_t *channel,
                                      const char *name, char **alias)
{
  ares_status_t status      = ARES_SUCCESS;
  const char   *hostaliases = NULL;
  ares_buf_t   *buf         = NULL;
  ares_array_t *lines       = NULL;
  size_t        num;
  size_t        i;

  if (channel == NULL || name == NULL || alias == NULL) {
    return ARES_EFORMERR; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  *alias = NULL;

  /* Configuration says to not perform alias lookup */
  if (channel->flags & ARES_FLAG_NOALIASES) {
    return ARES_ENOTFOUND;
  }

  /* If a domain has a '.', its not allowed to perform an alias lookup */
  if (strchr(name, '.') != NULL) {
    return ARES_ENOTFOUND;
  }

  hostaliases = getenv("HOSTALIASES");
  if (hostaliases == NULL) {
    status = ARES_ENOTFOUND;
    goto done;
  }

  buf = ares_buf_create();
  if (buf == NULL) {
    status = ARES_ENOMEM; /* LCOV_EXCL_LINE: OutOfMemory */
    goto done;            /* LCOV_EXCL_LINE: OutOfMemory */
  }

  status = ares_buf_load_file(hostaliases, buf);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  /* The HOSTALIASES file is structured as one alias per line.  The first
   * field in the line is the simple hostname with no periods, followed by
   * whitespace, then the full domain name, e.g.:
   *
   * c-ares  www.c-ares.org
   * curl    www.curl.se
   */

  status = ares_buf_split(buf, (const unsigned char *)"\n", 1,
                          ARES_BUF_SPLIT_TRIM, 0, &lines);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  num = ares_array_len(lines);
  for (i = 0; i < num; i++) {
    ares_buf_t **bufptr       = ares_array_at(lines, i);
    ares_buf_t  *line         = *bufptr;
    char         hostname[64] = "";
    char         fqdn[256]    = "";

    /* Pull off hostname */
    ares_buf_tag(line);
    ares_buf_consume_nonwhitespace(line);
    if (ares_buf_tag_fetch_string(line, hostname, sizeof(hostname)) !=
        ARES_SUCCESS) {
      continue;
    }

    /* Match hostname */
    if (!ares_strcaseeq(hostname, name)) {
      continue;
    }

    /* consume whitespace */
    ares_buf_consume_whitespace(line, ARES_TRUE);

    /* pull off fqdn */
    ares_buf_tag(line);
    ares_buf_consume_nonwhitespace(line);
    if (ares_buf_tag_fetch_string(line, fqdn, sizeof(fqdn)) != ARES_SUCCESS ||
        ares_strlen(fqdn) == 0) {
      continue;
    }

    /* Validate characterset */
    if (!ares_is_hostname(fqdn)) {
      continue;
    }

    *alias = ares_strdup(fqdn);
    if (*alias == NULL) {
      status = ARES_ENOMEM; /* LCOV_EXCL_LINE: OutOfMemory */
      goto done;            /* LCOV_EXCL_LINE: OutOfMemory */
    }

    /* Good! */
    status = ARES_SUCCESS;
    goto done;
  }

  status = ARES_ENOTFOUND;

done:
  ares_buf_destroy(buf);
  ares_array_destroy(lines);

  return status;
}